

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_tt.c
# Opt level: O0

HPDF_STATUS OnWrite(HPDF_Dict obj,HPDF_Stream_conflict stream)

{
  void *pvVar1;
  long lVar2;
  char *eptr_00;
  char *pcVar3;
  HPDF_STATUS HVar4;
  char *eptr;
  char *pbuf;
  char buf [128];
  HPDF_STATUS ret;
  HPDF_UINT i;
  HPDF_BasicEncoderAttr encoder_attr;
  HPDF_FontAttr attr;
  HPDF_Stream_conflict stream_local;
  HPDF_Dict obj_local;
  
  pvVar1 = obj->attr;
  lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x20) + 0xd0);
  eptr = (char *)&pbuf;
  eptr_00 = buf + 0x77;
  obj_local = (HPDF_Dict)HPDF_Stream_WriteEscapeName(stream,"Widths");
  if ((obj_local == (HPDF_Dict)0x0) &&
     (obj_local = (HPDF_Dict)HPDF_Stream_WriteStr(stream," [\n"), obj_local == (HPDF_Dict)0x0)) {
    for (ret._4_4_ = (uint)*(byte *)(lVar2 + 0x80); ret._4_4_ <= *(byte *)(lVar2 + 0x81);
        ret._4_4_ = ret._4_4_ + 1) {
      pcVar3 = HPDF_IToA(eptr,(int)*(short *)(*(long *)((long)pvVar1 + 0x28) + (ulong)ret._4_4_ * 2)
                         ,eptr_00);
      eptr = pcVar3 + 1;
      *pcVar3 = ' ';
      if ((ret._4_4_ + 1 & 0xf) == 0) {
        HPDF_StrCpy(eptr,"\n",eptr_00);
        HVar4 = HPDF_Stream_WriteStr(stream,(char *)&pbuf);
        if (HVar4 != 0) {
          return HVar4;
        }
        eptr = (char *)&pbuf;
      }
    }
    HPDF_StrCpy(eptr,"]\n",eptr_00);
    obj_local = (HPDF_Dict)HPDF_Stream_WriteStr(stream,(char *)&pbuf);
    if (obj_local == (HPDF_Dict)0x0) {
      obj_local = (HPDF_Dict)
                  (**(code **)(*(long *)((long)pvVar1 + 0x20) + 0xb8))
                            (*(undefined8 *)((long)pvVar1 + 0x20),stream);
    }
  }
  return (HPDF_STATUS)obj_local;
}

Assistant:

static HPDF_STATUS
OnWrite  (HPDF_Dict    obj,
          HPDF_Stream  stream)
{
    HPDF_FontAttr attr = (HPDF_FontAttr)obj->attr;
    HPDF_BasicEncoderAttr encoder_attr =
                    (HPDF_BasicEncoderAttr)attr->encoder->attr;
    HPDF_UINT i;
    HPDF_STATUS ret;
    char buf[128];
    char *pbuf = buf;
    char *eptr = buf + 127;

    HPDF_PTRACE ((" HPDF_Font_OnWrite\n"));

    /* Widths entry */
    if ((ret = HPDF_Stream_WriteEscapeName (stream, "Widths")) != HPDF_OK)
        return ret;

    if ((ret = HPDF_Stream_WriteStr (stream, " [\012")) != HPDF_OK)
        return ret;

    for (i = encoder_attr->first_char; i <= encoder_attr->last_char; i++) {

        pbuf = HPDF_IToA (pbuf, attr->widths[i], eptr);
        *pbuf++ = ' ';

        if ((i + 1) % 16 == 0) {
            HPDF_StrCpy(pbuf, "\012", eptr);
            if ((ret = HPDF_Stream_WriteStr (stream, buf)) != HPDF_OK)
                return ret;
            pbuf = buf;
        }

    }

    HPDF_StrCpy (pbuf, "]\012", eptr);

    if ((ret = HPDF_Stream_WriteStr (stream, buf)) != HPDF_OK)
        return ret;

    return attr->encoder->write_fn (attr->encoder, stream);
}